

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

char * imap_atom(char *str,_Bool escape_only)

{
  CURLcode CVar1;
  size_t sVar2;
  size_t sVar3;
  size_t len;
  size_t nclean;
  dynbuf line;
  char *pcStack_18;
  _Bool escape_only_local;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    line.toobig._7_1_ = escape_only;
    sVar2 = strlen(str);
    sVar3 = strcspn(str,"() {%*]\\\"");
    if (sVar2 == sVar3) {
      str_local = (*Curl_cstrdup)(str);
    }
    else {
      Curl_dyn_init((dynbuf *)&nclean,2000);
      pcStack_18 = str;
      if (((line.toobig._7_1_ & 1) == 0) &&
         (CVar1 = Curl_dyn_addn((dynbuf *)&nclean,"\"",1), CVar1 != CURLE_OK)) {
        str_local = (char *)0x0;
      }
      else {
        for (; *pcStack_18 != '\0'; pcStack_18 = pcStack_18 + 1) {
          if (((*pcStack_18 == '\\') || (*pcStack_18 == '\"')) &&
             (CVar1 = Curl_dyn_addn((dynbuf *)&nclean,"\\",1), CVar1 != CURLE_OK)) {
            return (char *)0x0;
          }
          CVar1 = Curl_dyn_addn((dynbuf *)&nclean,pcStack_18,1);
          if (CVar1 != CURLE_OK) {
            return (char *)0x0;
          }
        }
        if (((line.toobig._7_1_ & 1) == 0) &&
           (CVar1 = Curl_dyn_addn((dynbuf *)&nclean,"\"",1), CVar1 != CURLE_OK)) {
          str_local = (char *)0x0;
        }
        else {
          str_local = Curl_dyn_ptr((dynbuf *)&nclean);
        }
      }
    }
  }
  return str_local;
}

Assistant:

static char *imap_atom(const char *str, bool escape_only)
{
  struct dynbuf line;
  size_t nclean;
  size_t len;

  if(!str)
    return NULL;

  len = strlen(str);
  nclean = strcspn(str, "() {%*]\\\"");
  if(len == nclean)
    /* nothing to escape, return a strdup */
    return strdup(str);

  Curl_dyn_init(&line, 2000);

  if(!escape_only && Curl_dyn_addn(&line, "\"", 1))
    return NULL;

  while(*str) {
    if((*str == '\\' || *str == '"') &&
       Curl_dyn_addn(&line, "\\", 1))
      return NULL;
    if(Curl_dyn_addn(&line, str, 1))
      return NULL;
    str++;
  }

  if(!escape_only && Curl_dyn_addn(&line, "\"", 1))
    return NULL;

  return Curl_dyn_ptr(&line);
}